

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_raster.cpp
# Opt level: O0

void gray_render_line(gray_PWorker worker,TPos to_x,TPos to_y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long ex;
  long ey;
  ulong uVar12;
  long lVar13;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long dy_r;
  long dx_r;
  TArea prod;
  TCoord ey2;
  TCoord ey1;
  TCoord ex2;
  TCoord ex1;
  TPos fy2;
  TPos fx2;
  TPos fy1;
  TPos fx1;
  TPos dy;
  TPos dx;
  bool local_81;
  TCoord in_stack_ffffffffffffff80;
  TCoord in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  long local_60;
  long local_50;
  ulong local_38;
  ulong local_30;
  
  local_50 = *(long *)(in_RDI + 0x70) >> 8;
  local_60 = *(long *)(in_RDI + 0x78) >> 8;
  lVar9 = in_RDX >> 8;
  if (((local_60 < *(long *)(in_RDI + 0x28)) || (lVar9 < *(long *)(in_RDI + 0x28))) &&
     ((*(long *)(in_RDI + 0x20) <= local_60 || (*(long *)(in_RDI + 0x20) <= lVar9)))) {
    lVar10 = in_RSI - *(long *)(in_RDI + 0x70);
    lVar11 = in_RDX - *(long *)(in_RDI + 0x78);
    local_30 = *(long *)(in_RDI + 0x70) + local_50 * -0x100;
    local_38 = *(long *)(in_RDI + 0x78) + local_60 * -0x100;
    if ((local_50 != in_RSI >> 8) || (local_60 != lVar9)) {
      if (lVar11 == 0) {
        gray_set_cell((gray_PWorker)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      }
      else if (lVar10 == 0) {
        if (lVar11 < 1) {
          do {
            *(ulong *)(in_RDI + 0x48) = *(long *)(in_RDI + 0x48) - local_38;
            *(int *)(in_RDI + 0x40) = *(int *)(in_RDI + 0x40) + -(int)local_38 * (int)local_30 * 2;
            local_38 = 0x100;
            local_60 = local_60 + -1;
            gray_set_cell((gray_PWorker)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
          } while (local_60 != lVar9);
        }
        else {
          do {
            *(ulong *)(in_RDI + 0x48) = (0x100 - local_38) + *(long *)(in_RDI + 0x48);
            *(int *)(in_RDI + 0x40) =
                 *(int *)(in_RDI + 0x40) + (0x100 - (int)local_38) * (int)local_30 * 2;
            local_38 = 0;
            local_60 = local_60 + 1;
            gray_set_cell((gray_PWorker)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
          } while (local_60 != lVar9);
        }
      }
      else {
        iVar3 = (int)lVar10;
        iVar4 = (int)lVar11;
        iVar8 = iVar3 * (int)local_38 - iVar4 * (int)local_30;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = SUB168(SEXT816(0xffffffffffffff),8);
        ex = SUB168((auVar1 << 0x40 | ZEXT816(0xffffffffffffff)) / SEXT816(lVar10),0);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = SUB168(SEXT816(0xffffffffffffff),8);
        ey = SUB168((auVar2 << 0x40 | ZEXT816(0xffffffffffffff)) / SEXT816(lVar11),0);
        do {
          iVar6 = (int)local_30;
          iVar7 = (int)local_38;
          if ((iVar8 < 1) && (0 < (long)iVar8 + lVar10 * -0x100)) {
            iVar5 = -iVar8;
            uVar12 = (ulong)((long)iVar5 * -ex) >> 0x38;
            iVar8 = iVar8 + iVar4 * -0x100;
            *(ulong *)(in_RDI + 0x48) = (uVar12 - local_38) + *(long *)(in_RDI + 0x48);
            *(uint *)(in_RDI + 0x40) =
                 *(int *)(in_RDI + 0x40) +
                 ((uint)(byte)((ulong)((long)iVar5 * -ex) >> 0x38) - iVar7) * iVar6;
            local_30 = 0x100;
            local_50 = local_50 + -1;
            local_38 = uVar12;
          }
          else if (((long)iVar8 + lVar10 * -0x100 < 1) &&
                  (0 < (long)iVar8 + lVar10 * -0x100 + lVar11 * 0x100)) {
            iVar8 = iVar8 + iVar3 * -0x100;
            local_30 = (ulong)(-iVar8 * ey) >> 0x38;
            *(ulong *)(in_RDI + 0x48) = (0x100 - local_38) + *(long *)(in_RDI + 0x48);
            *(uint *)(in_RDI + 0x40) =
                 *(int *)(in_RDI + 0x40) +
                 (0x100 - iVar7) * (iVar6 + (uint)(byte)((ulong)(-iVar8 * ey) >> 0x38));
            local_38 = 0;
            local_60 = local_60 + 1;
          }
          else if (((long)iVar8 + lVar10 * -0x100 + lVar11 * 0x100 < 1) &&
                  (-1 < (long)iVar8 + lVar11 * 0x100)) {
            iVar8 = iVar8 + iVar4 * 0x100;
            uVar12 = (ulong)(iVar8 * ex) >> 0x38;
            *(ulong *)(in_RDI + 0x48) = (uVar12 - local_38) + *(long *)(in_RDI + 0x48);
            *(uint *)(in_RDI + 0x40) =
                 *(int *)(in_RDI + 0x40) +
                 ((uint)(byte)((ulong)(iVar8 * ex) >> 0x38) - iVar7) * (iVar6 + 0x100);
            local_30 = 0;
            local_50 = local_50 + 1;
            local_38 = uVar12;
          }
          else {
            lVar13 = (long)iVar8;
            local_30 = (ulong)(lVar13 * -ey) >> 0x38;
            iVar8 = iVar8 + iVar3 * 0x100;
            *(ulong *)(in_RDI + 0x48) = *(long *)(in_RDI + 0x48) - local_38;
            *(uint *)(in_RDI + 0x40) =
                 *(int *)(in_RDI + 0x40) +
                 -iVar7 * (iVar6 + (uint)(byte)((ulong)(lVar13 * -ey) >> 0x38));
            local_38 = 0x100;
            local_60 = local_60 + -1;
          }
          gray_set_cell((gray_PWorker)CONCAT44(iVar8,in_stack_ffffffffffffff90),ex,ey);
          local_81 = local_50 != in_RSI >> 8 || local_60 != lVar9;
        } while (local_81);
      }
    }
    lVar9 = in_RDX + lVar9 * -0x100;
    *(ulong *)(in_RDI + 0x48) = (lVar9 - local_38) + *(long *)(in_RDI + 0x48);
    *(int *)(in_RDI + 0x40) =
         *(int *)(in_RDI + 0x40) +
         ((int)lVar9 - (int)local_38) *
         ((int)local_30 + (int)in_RSI + (int)((ulong)in_RSI >> 8) * -0x100);
  }
  *(long *)(in_RDI + 0x70) = in_RSI;
  *(long *)(in_RDI + 0x78) = in_RDX;
  return;
}

Assistant:

static void gray_render_line(RAS_ARG_ TPos to_x, TPos to_y)
{
    TPos   dx, dy, fx1, fy1, fx2, fy2;
    TCoord ex1, ex2, ey1, ey2;

    ex1 = TRUNC(ras.x);
    ex2 = TRUNC(to_x);
    ey1 = TRUNC(ras.y);
    ey2 = TRUNC(to_y);

    /* perform vertical clipping */
    if ((ey1 >= ras.max_ey && ey2 >= ras.max_ey) ||
        (ey1 < ras.min_ey && ey2 < ras.min_ey))
        goto End;

    dx = to_x - ras.x;
    dy = to_y - ras.y;

    fx1 = ras.x - SUBPIXELS(ex1);
    fy1 = ras.y - SUBPIXELS(ey1);

    if (ex1 == ex2 && ey1 == ey2) /* inside one cell */
        ;
    else if (dy == 0) /* ex1 != ex2 */ /* any horizontal line */
    {
        ex1 = ex2;
        gray_set_cell(RAS_VAR_ ex1, ey1);
    } else if (dx == 0) {
        if (dy > 0) /* vertical line up */
            do {
                fy2 = ONE_PIXEL;
                ras.cover += (fy2 - fy1);
                ras.area += (fy2 - fy1) * fx1 * 2;
                fy1 = 0;
                ey1++;
                gray_set_cell(RAS_VAR_ ex1, ey1);
            } while (ey1 != ey2);
        else /* vertical line down */
            do {
                fy2 = 0;
                ras.cover += (fy2 - fy1);
                ras.area += (fy2 - fy1) * fx1 * 2;
                fy1 = ONE_PIXEL;
                ey1--;
                gray_set_cell(RAS_VAR_ ex1, ey1);
            } while (ey1 != ey2);
    } else /* any other line */
    {
        TArea prod = dx * fy1 - dy * fx1;
        SW_FT_UDIVPREP(dx);
        SW_FT_UDIVPREP(dy);

        /* The fundamental value `prod' determines which side and the  */
        /* exact coordinate where the line exits current cell.  It is  */
        /* also easily updated when moving from one cell to the next.  */
        do {
            if (prod <= 0 && prod - dx * ONE_PIXEL > 0) /* left */
            {
                fx2 = 0;
                fy2 = (TPos)SW_FT_UDIV(-prod, -dx);
                prod -= dy * ONE_PIXEL;
                ras.cover += (fy2 - fy1);
                ras.area += (fy2 - fy1) * (fx1 + fx2);
                fx1 = ONE_PIXEL;
                fy1 = fy2;
                ex1--;
            } else if (prod - dx * ONE_PIXEL <= 0 &&
                       prod - dx * ONE_PIXEL + dy * ONE_PIXEL > 0) /* up */
            {
                prod -= dx * ONE_PIXEL;
                fx2 = (TPos)SW_FT_UDIV(-prod, dy);
                fy2 = ONE_PIXEL;
                ras.cover += (fy2 - fy1);
                ras.area += (fy2 - fy1) * (fx1 + fx2);
                fx1 = fx2;
                fy1 = 0;
                ey1++;
            } else if (prod - dx * ONE_PIXEL + dy * ONE_PIXEL <= 0 &&
                       prod + dy * ONE_PIXEL >= 0) /* right */
            {
                prod += dy * ONE_PIXEL;
                fx2 = ONE_PIXEL;
                fy2 = (TPos)SW_FT_UDIV(prod, dx);
                ras.cover += (fy2 - fy1);
                ras.area += (fy2 - fy1) * (fx1 + fx2);
                fx1 = 0;
                fy1 = fy2;
                ex1++;
            } else /* ( prod                  + dy * ONE_PIXEL <  0 &&
                        prod                                   >  0 )    down */
            {
                fx2 = (TPos)SW_FT_UDIV(prod, -dy);
                fy2 = 0;
                prod += dx * ONE_PIXEL;
                ras.cover += (fy2 - fy1);
                ras.area += (fy2 - fy1) * (fx1 + fx2);
                fx1 = fx2;
                fy1 = ONE_PIXEL;
                ey1--;
            }

            gray_set_cell(RAS_VAR_ ex1, ey1);
        } while (ex1 != ex2 || ey1 != ey2);
    }

    fx2 = to_x - SUBPIXELS(ex2);
    fy2 = to_y - SUBPIXELS(ey2);

    ras.cover += (fy2 - fy1);
    ras.area += (fy2 - fy1) * (fx1 + fx2);

End:
    ras.x = to_x;
    ras.y = to_y;
}